

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_BFCI(DisasContext_conflict1 *s,arg_BFCI *a)

{
  uint ofs;
  ulong uVar1;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 arg1;
  uint len;
  uintptr_t o;
  
  uVar1 = s->features;
  if ((uVar1 & 0x40) != 0) {
    ofs = a->lsb;
    if (a->msb < (int)ofs) {
      unallocated_encoding_aarch64(s);
    }
    else {
      tcg_ctx = s->uc->tcg_ctx;
      len = (a->msb - ofs) + 1;
      if (a->rn == 0xf) {
        ret = tcg_const_i32_aarch64(tcg_ctx,0);
      }
      else {
        ret = load_reg(s,a->rn);
      }
      if (len != 0x20) {
        arg1 = load_reg(s,a->rd);
        tcg_gen_deposit_i32_aarch64(tcg_ctx,ret,arg1,ret,ofs,len);
        tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
      }
      store_reg(s,a->rd,ret);
    }
  }
  return SUB41(((uint)uVar1 & 0x40) >> 6,0);
}

Assistant:

static bool trans_BFCI(DisasContext *s, arg_BFCI *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;
    int msb = a->msb, lsb = a->lsb;
    int width;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    if (msb < lsb) {
        /* UNPREDICTABLE; we choose to UNDEF */
        unallocated_encoding(s);
        return true;
    }

    width = msb + 1 - lsb;
    if (a->rn == 15) {
        /* BFC */
        tmp = tcg_const_i32(tcg_ctx, 0);
    } else {
        /* BFI */
        tmp = load_reg(s, a->rn);
    }
    if (width != 32) {
        TCGv_i32 tmp2 = load_reg(s, a->rd);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, lsb, width);
        tcg_temp_free_i32(tcg_ctx, tmp2);
    }
    store_reg(s, a->rd, tmp);
    return true;
}